

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O3

CURLcode resolve_server(Curl_easy *data,connectdata *conn,_Bool *async)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined4 uVar3;
  resolve_t rVar4;
  timediff_t tVar5;
  char *pcVar6;
  long lVar7;
  curltime cVar8;
  curltime older;
  curltime newer;
  Curl_dns_entry *local_38;
  
  if (SUB41(conn->bits,0) < '\0') {
    *async = false;
  }
  else {
    if (((uint)conn->bits & 0x20) == 0) {
      local_38 = (Curl_dns_entry *)0x0;
      tVar5 = Curl_timeleft(data,(curltime *)0x0,true);
      lVar7 = 0x70;
      if (((uint)conn->bits >> 9 & 1) == 0) {
        lVar7 = 0x40;
      }
      conn->port = *(int *)((long)&conn->remote_port + (ulong)((uint)conn->bits >> 8 & 4));
      pcVar6 = (*Curl_cstrdup)(*(char **)((long)&(conn->bundle_node).next + lVar7));
      conn->hostname_resolve = pcVar6;
      if (pcVar6 == (char *)0x0) {
        return CURLE_OUT_OF_MEMORY;
      }
      rVar4 = Curl_resolv_timeout(data,pcVar6,conn->port,&local_38,tVar5);
      conn->dns_entry = local_38;
      if (rVar4 == CURLRESOLV_TIMEDOUT) {
        uVar1 = *(undefined8 *)((long)&conn->fclosesocket + lVar7);
        cVar8 = Curl_now();
        uVar2 = (data->progress).t_startsingle.tv_sec;
        uVar3 = (data->progress).t_startsingle.tv_usec;
        older.tv_usec = uVar3;
        older.tv_sec = uVar2;
        older._12_4_ = 0;
        newer._12_4_ = 0;
        newer.tv_sec = SUB128(cVar8._0_12_,0);
        newer.tv_usec = SUB124(cVar8._0_12_,8);
        tVar5 = Curl_timediff(newer,older);
        Curl_failf(data,"Failed to resolve host \'%s\' with timeout after %ld ms",uVar1,tVar5);
        return CURLE_OPERATION_TIMEDOUT;
      }
      if (rVar4 != CURLRESOLV_PENDING) {
        if (local_38 == (Curl_dns_entry *)0x0) {
          Curl_failf(data,"Could not resolve host: %s",
                     *(undefined8 *)((long)&conn->fclosesocket + lVar7));
          return CURLE_COULDNT_RESOLVE_HOST;
        }
        return CURLE_OK;
      }
    }
    else {
      local_38 = (Curl_dns_entry *)0x0;
      tVar5 = Curl_timeleft(data,(curltime *)0x0,true);
      lVar7 = 0x90;
      if (((uint)conn->bits & 2) == 0) {
        lVar7 = 200;
      }
      pcVar6 = (*Curl_cstrdup)(*(char **)((long)&(conn->bundle_node).next + lVar7));
      conn->hostname_resolve = pcVar6;
      if (pcVar6 == (char *)0x0) {
        return CURLE_OUT_OF_MEMORY;
      }
      rVar4 = Curl_resolv_timeout(data,pcVar6,conn->port,&local_38,tVar5);
      conn->dns_entry = local_38;
      if (rVar4 == CURLRESOLV_TIMEDOUT) {
        return CURLE_OPERATION_TIMEDOUT;
      }
      if (rVar4 != CURLRESOLV_PENDING) {
        if (local_38 == (Curl_dns_entry *)0x0) {
          Curl_failf(data,"Couldn\'t resolve proxy \'%s\'",
                     *(undefined8 *)((long)&conn->fclosesocket + lVar7));
          return CURLE_COULDNT_RESOLVE_PROXY;
        }
        return CURLE_OK;
      }
    }
    *async = true;
  }
  return CURLE_OK;
}

Assistant:

static CURLcode resolve_server(struct Curl_easy *data,
                               struct connectdata *conn,
                               bool *async)
{
  DEBUGASSERT(conn);
  DEBUGASSERT(data);

  /* Resolve the name of the server or proxy */
  if(conn->bits.reuse) {
    /* We're reusing the connection - no need to resolve anything, and
       idnconvert_hostname() was called already in create_conn() for the reuse
       case. */
    *async = FALSE;
    return CURLE_OK;
  }

  return resolve_fresh(data, conn, async);
}